

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

basic_fp<unsigned_long_long> __thiscall
fmt::v9::detail::normalize<0,unsigned_long_long>(detail *this,basic_fp<unsigned_long_long> value)

{
  basic_fp<unsigned_long_long> bVar1;
  int offset;
  unsigned_long_long shifted_implicit_bit;
  unsigned_long_long implicit_bit;
  basic_fp<unsigned_long_long> value_local;
  
  value_local.e = (int)value.f;
  for (value_local.f = (unsigned_long_long)this; (value_local.f & 0x10000000000000) == 0;
      value_local.f = value_local.f << 1) {
    value_local.e = value_local.e + -1;
  }
  bVar1.f = value_local.f << 0xb;
  bVar1.e = value_local.e + -0xb;
  bVar1._12_4_ = 0;
  return bVar1;
}

Assistant:

FMT_CONSTEXPR basic_fp<F> normalize(basic_fp<F> value) {
  // Handle subnormals.
  const auto implicit_bit = F(1) << num_significand_bits<double>();
  const auto shifted_implicit_bit = implicit_bit << SHIFT;
  while ((value.f & shifted_implicit_bit) == 0) {
    value.f <<= 1;
    --value.e;
  }
  // Subtract 1 to account for hidden bit.
  const auto offset = basic_fp<F>::num_significand_bits -
                      num_significand_bits<double>() - SHIFT - 1;
  value.f <<= offset;
  value.e -= offset;
  return value;
}